

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR FileMappingInitializationRoutine
                    (CPalThread *pThread,CObjectType *pObjectType,void *pvImmutableData,
                    void *pvSharedData,void *pvProcessLocalData)

{
  INT nFlags;
  int iVar1;
  CFileMappingProcessLocalData *pProcessLocalData;
  CFileMappingImmutableData *pImmutableData;
  PAL_ERROR palError;
  void *pvProcessLocalData_local;
  void *pvSharedData_local;
  void *pvImmutableData_local;
  CObjectType *pObjectType_local;
  CPalThread *pThread_local;
  
  pImmutableData._4_4_ = 0;
  nFlags = MAPProtectionToFileOpenFlags(*(DWORD *)((long)pvImmutableData + 0x1004));
  iVar1 = CorUnix::InternalOpen((char *)pvImmutableData,nFlags);
  *(int *)pvProcessLocalData = iVar1;
  if (*pvProcessLocalData == -1) {
    pImmutableData._4_4_ = 0x54f;
  }
  return pImmutableData._4_4_;
}

Assistant:

PAL_ERROR
FileMappingInitializationRoutine(
    CPalThread *pThread,
    CObjectType *pObjectType,
    void *pvImmutableData,
    void *pvSharedData,
    void *pvProcessLocalData
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    CFileMappingImmutableData *pImmutableData =
        reinterpret_cast<CFileMappingImmutableData *>(pvImmutableData);
    CFileMappingProcessLocalData *pProcessLocalData =
        reinterpret_cast<CFileMappingProcessLocalData *>(pvProcessLocalData);

    pProcessLocalData->UnixFd = InternalOpen(
        pImmutableData->szFileName,
        MAPProtectionToFileOpenFlags(pImmutableData->flProtect)
        );

    if (-1 == pProcessLocalData->UnixFd)
    {
        palError = ERROR_INTERNAL_ERROR;
        goto ExitFileMappingInitializationRoutine;
    }

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    struct stat st;

    if (0 == fstat(pProcessLocalData->UnixFd, &st))
    {
        pProcessLocalData->MappedFileDevNum = st.st_dev;
        pProcessLocalData->MappedFileInodeNum = st.st_ino;
    }
    else
    {
        ERROR("Couldn't get inode info for fd=%d to be stored in mapping object\n", pProcessLocalData->UnixFd);
    }
#endif

ExitFileMappingInitializationRoutine:    

    return palError;
}